

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O2

void Io_WriteAigerGz(Abc_Ntk_t *pNtk,char *pFileName,int fWriteSymbols)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  void **ppvVar5;
  int *piVar6;
  uint uVar7;
  int iVar8;
  gzFile file;
  Abc_Obj_t *pAVar9;
  void *pvVar10;
  uchar *pBuffer;
  ProgressBar *p;
  uint x;
  ulong uVar11;
  char *pString;
  long lVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  char *format;
  size_t __size;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar16;
  uint uVar17;
  int local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                  ,0x1bd,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
  }
  file = gzopen(pFileName,"wb");
  if (file == (gzFile)0x0) {
    fprintf(_stdout,"Io_WriteAigerGz(): Cannot open the output file \"%s\".\n",pFileName);
    return;
  }
  iVar2 = pNtk->nConstrs;
  pAVar9 = Abc_AigConst1(pNtk);
  (pAVar9->field_6).pTemp = (void *)0x0;
  aVar16 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
  for (iVar13 = 0; iVar13 < pNtk->vCis->nSize; iVar13 = iVar13 + 1) {
    pAVar9 = Abc_NtkCi(pNtk,iVar13);
    pAVar9->field_6 = aVar16;
    aVar16.pTemp = (void *)((long)&(aVar16.pCopy)->pNtk + 1);
  }
  for (iVar13 = 0; iVar13 < pNtk->vObjs->nSize; iVar13 = iVar13 + 1) {
    pAVar9 = Abc_NtkObj(pNtk,iVar13);
    if ((pAVar9 != (Abc_Obj_t *)0x0) && (iVar8 = Abc_AigNodeIsAnd(pAVar9), iVar8 != 0)) {
      pvVar10 = aVar16.pTemp & 0xffffffff;
      aVar16._0_4_ = aVar16.iTemp + 1;
      aVar16._4_4_ = 0;
      (pAVar9->field_6).pTemp = pvVar10;
    }
  }
  uVar14 = pNtk->vPis->nSize;
  uVar3 = pNtk->nObjCounts[8];
  iVar13 = pNtk->nObjCounts[7];
  uVar11 = (ulong)(uVar3 + iVar13 + uVar14);
  if (iVar2 == 0) {
    gzprintf(file,"aig %u %u %u %u %u",uVar11,(ulong)uVar14,(ulong)uVar3,
             (ulong)(uint)pNtk->vPos->nSize,iVar13);
  }
  else {
    gzprintf(file,"aig %u %u %u %u %u",uVar11,(ulong)uVar14,(ulong)uVar3,0,iVar13);
    gzprintf(file," %u %u",(ulong)(uint)(pNtk->vPos->nSize - pNtk->nConstrs));
  }
  gzprintf(file,"\n");
  Abc_NtkInvertConstraints(pNtk);
  for (iVar13 = 0; iVar13 < pNtk->vBoxes->nSize; iVar13 = iVar13 + 1) {
    pAVar9 = Abc_NtkBox(pNtk,iVar13);
    if ((*(uint *)&pAVar9->field_0x14 & 0xf) == 8) {
      plVar4 = (long *)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray];
      iVar8 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                (long)*(int *)plVar4[4] * 8) + 0x40);
      uVar11 = (ulong)(((uint)(iVar8 == 0) ^ *(uint *)((long)plVar4 + 0x14) >> 10 & 1) + iVar8 * 2);
      iVar8 = Abc_LatchIsInit0(pAVar9);
      if (iVar8 == 0) {
        iVar8 = Abc_LatchIsInit1(pAVar9);
        if (iVar8 == 0) {
          iVar8 = Abc_LatchIsInitNone(pAVar9);
          if ((iVar8 == 0) && (iVar8 = Abc_LatchIsInitDc(pAVar9), iVar8 == 0)) {
            __assert_fail("Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                          ,0x1ee,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
          }
          gzprintf(file,"%u %u\n",uVar11,
                   (ulong)(uint)(*(int *)((long)pAVar9->pNtk->vObjs->pArray
                                                [*(pAVar9->vFanouts).pArray] + 0x40) * 2));
          goto LAB_0029d615;
        }
        pcVar15 = "%u 1\n";
      }
      else {
        pcVar15 = "%u\n";
      }
      gzprintf(file,pcVar15,uVar11);
    }
LAB_0029d615:
  }
  for (iVar13 = 0; iVar13 < pNtk->vPos->nSize; iVar13 = iVar13 + 1) {
    pAVar9 = Abc_NtkPo(pNtk,iVar13);
    iVar8 = *(int *)((long)pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanins).pArray] + 0x40);
    gzprintf(file,"%u\n",
             (ulong)(((uint)(iVar8 == 0) ^ *(uint *)&pAVar9->field_0x14 >> 10 & 1) + iVar8 * 2));
  }
  Abc_NtkInvertConstraints(pNtk);
  lVar12 = (long)pNtk->nObjCounts[7] * 6;
  __size = lVar12 + 100;
  pBuffer = (uchar *)malloc(__size);
  p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
  uVar14 = 0;
  iVar13 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar13) {
      local_38 = (int)__size;
      if (local_38 <= (int)uVar14) {
        __assert_fail("Pos < nBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                      ,0x215,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
      }
      Extra_ProgressBarStop(p);
      gzwrite(file,pBuffer,uVar14);
      free(pBuffer);
      if (fWriteSymbols != 0) {
        for (uVar14 = 0; (int)uVar14 < pNtk->vPis->nSize; uVar14 = uVar14 + 1) {
          pAVar9 = Abc_NtkPi(pNtk,uVar14);
          pcVar15 = Abc_ObjName(pAVar9);
          gzprintf(file,"i%d %s\n",(ulong)uVar14,pcVar15);
        }
        for (uVar14 = 0; (int)uVar14 < pNtk->vBoxes->nSize; uVar14 = uVar14 + 1) {
          pAVar9 = Abc_NtkBox(pNtk,uVar14);
          if ((*(uint *)&pAVar9->field_0x14 & 0xf) == 8) {
            pcVar15 = Abc_ObjName((Abc_Obj_t *)
                                  pAVar9->pNtk->vObjs->pArray[*(pAVar9->vFanouts).pArray]);
            gzprintf(file,"l%d %s\n",(ulong)uVar14,pcVar15);
          }
        }
        for (uVar14 = 0; (int)uVar14 < pNtk->vPos->nSize; uVar14 = uVar14 + 1) {
          pAVar9 = Abc_NtkPo(pNtk,uVar14);
          uVar3 = uVar14;
          if (iVar2 == 0) {
            pcVar15 = Abc_ObjName(pAVar9);
            format = "o%d %s\n";
          }
          else {
            iVar13 = pNtk->vPos->nSize;
            iVar8 = pNtk->nConstrs;
            if ((int)uVar14 < iVar13 - iVar8) {
              pcVar15 = Abc_ObjName(pAVar9);
              format = "b%d %s\n";
            }
            else {
              pcVar15 = Abc_ObjName(pAVar9);
              format = "c%d %s\n";
              uVar3 = (iVar8 - iVar13) + uVar14;
            }
          }
          gzprintf(file,format,(ulong)uVar3,pcVar15);
        }
      }
      gzprintf(file,"c\n");
      if ((pNtk->pName != (char *)0x0) && (*pNtk->pName != '\0')) {
        gzprintf(file,".model %s\n");
      }
      pcVar15 = Extra_TimeStamp();
      gzprintf(file,"This file was produced by ABC on %s\n",pcVar15);
      gzprintf(file,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
LAB_0029d9af:
      gzclose(file);
      return;
    }
    pAVar9 = Abc_NtkObj(pNtk,iVar13);
    if ((pAVar9 != (Abc_Obj_t *)0x0) && (iVar8 = Abc_AigNodeIsAnd(pAVar9), iVar8 != 0)) {
      Extra_ProgressBarUpdate(p,iVar13,pString);
      uVar7 = (pAVar9->field_6).iTemp * 2;
      ppvVar5 = pAVar9->pNtk->vObjs->pArray;
      piVar6 = (pAVar9->vFanins).pArray;
      uVar3 = (*(uint *)&pAVar9->field_0x14 >> 10 & 1) + *(int *)((long)ppvVar5[*piVar6] + 0x40) * 2
      ;
      uVar1 = (*(uint *)&pAVar9->field_0x14 >> 0xb & 1) +
              *(int *)((long)ppvVar5[piVar6[1]] + 0x40) * 2;
      uVar17 = uVar1;
      if (uVar1 < uVar3) {
        uVar17 = uVar3;
      }
      x = uVar7 - uVar17;
      if (uVar7 < uVar17 || x == 0) {
        __assert_fail("uLit1 < uLit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                      ,0x20b,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
      }
      if (uVar3 < uVar1) {
        uVar1 = uVar3;
      }
      iVar8 = Io_WriteAigerEncode(pBuffer,uVar14,x);
      uVar14 = Io_WriteAigerEncode(pBuffer,iVar8,uVar17 - uVar1);
      if ((int)lVar12 + 0x5a < (int)uVar14) {
        puts(
            "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small."
            );
        goto LAB_0029d9af;
      }
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

void Io_WriteAigerGz( Abc_Ntk_t * pNtk, char * pFileName, int fWriteSymbols )
{
    ProgressBar * pProgress;
    gzFile pFile;
    Abc_Obj_t * pObj, * pDriver, * pLatch;
    int i, nNodes, Pos, nBufferSize, fExtended;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    assert( Abc_NtkIsStrash(pNtk) );
    // start the output stream
    pFile = gzopen( pFileName, "wb" ); // if pFileName doesn't end in ".gz" then this acts as a passthrough to fopen
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteAigerGz(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    fExtended = Abc_NtkConstrNum(pNtk);

    // set the node numbers to be used in the output file
    nNodes = 0;
    Io_ObjSetAigerNum( Abc_AigConst1(pNtk), nNodes++ );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    gzprintf( pFile, "aig %u %u %u %u %u", 
              Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) + Abc_NtkNodeNum(pNtk), 
              Abc_NtkPiNum(pNtk),
              Abc_NtkLatchNum(pNtk),
              fExtended ? 0 : Abc_NtkPoNum(pNtk),
              Abc_NtkNodeNum(pNtk) );
    // write the extended header "B C J F"
    if ( fExtended )
        gzprintf( pFile, " %u %u", Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk), Abc_NtkConstrNum(pNtk) );
    gzprintf( pFile, "\n" ); 

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    // write latch drivers
    Abc_NtkInvertConstraints( pNtk );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        pObj = Abc_ObjFanin0(pLatch);
        pDriver = Abc_ObjFanin0(pObj);
        uLit = Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) );
        if ( Abc_LatchIsInit0(pLatch) )
            gzprintf( pFile, "%u\n", uLit );
        else if ( Abc_LatchIsInit1(pLatch) )
            gzprintf( pFile, "%u 1\n", uLit );
        else
        {
            // Both None and DC are written as 'uninitialized' e.g. a free boolean value
            assert( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) );
            gzprintf( pFile, "%u %u\n", uLit, Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanout0(pLatch)), 0 ) );
        }
    }
    // write PO drivers
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        gzprintf( pFile, "%u\n", Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    Abc_NtkInvertConstraints( pNtk );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Abc_NtkNodeNum(pNtk) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit  = Io_ObjMakeLit( Io_ObjAigerNum(pObj), 0 );
        uLit0 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin0(pObj)), Abc_ObjFaninC0(pObj) );
        uLit1 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin1(pObj)), Abc_ObjFaninC1(pObj) );
        if ( uLit0 > uLit1 )
        {
            unsigned Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        assert( uLit1 < uLit );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, uLit  - uLit1 );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
	        gzclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
    Extra_ProgressBarStop( pProgress );

    // write the buffer
    gzwrite(pFile, pBuffer, Pos);
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( fWriteSymbols )
    {
        // write PIs
        Abc_NtkForEachPi( pNtk, pObj, i )
            gzprintf( pFile, "i%d %s\n", i, Abc_ObjName(pObj) );
        // write latches
        Abc_NtkForEachLatch( pNtk, pObj, i )
            gzprintf( pFile, "l%d %s\n", i, Abc_ObjName(Abc_ObjFanout0(pObj)) );
        // write POs
        Abc_NtkForEachPo( pNtk, pObj, i )
            if ( !fExtended )
                gzprintf( pFile, "o%d %s\n", i, Abc_ObjName(pObj) );
            else if ( i < Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
                gzprintf( pFile, "b%d %s\n", i, Abc_ObjName(pObj) );
            else
                gzprintf( pFile, "c%d %s\n", i - (Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk)), Abc_ObjName(pObj) );
    }

    // write the comment
    gzprintf( pFile, "c\n" );
    if ( pNtk->pName && strlen(pNtk->pName) > 0 )
        gzprintf( pFile, ".model %s\n", pNtk->pName );
    gzprintf( pFile, "This file was produced by ABC on %s\n", Extra_TimeStamp() );
    gzprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
	gzclose( pFile );
}